

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

int psa_key_algorithm_permits(psa_algorithm_t policy_alg,psa_algorithm_t requested_alg)

{
  if (requested_alg == policy_alg) {
    return 1;
  }
  if (((((requested_alg & 0xffffff00 | 0x10000) == 0x10030000) ||
       ((requested_alg & 0xfffeff00 | 0x20000) == 0x10060000)) &&
      (((policy_alg & 0xffffff00 | 0x10000) == 0x10030000 ||
       ((policy_alg & 0xfffeff00 | 0x20000) == 0x10060000)))) && ((char)policy_alg == -1)) {
    return (uint)((policy_alg & 0xffffff00) == (requested_alg & 0xffffff00));
  }
  return 0;
}

Assistant:

static int psa_key_algorithm_permits( psa_algorithm_t policy_alg,
                                      psa_algorithm_t requested_alg )
{
    /* Common case: the policy only allows requested_alg. */
    if( requested_alg == policy_alg )
        return( 1 );
    /* If policy_alg is a hash-and-sign with a wildcard for the hash,
     * and requested_alg is the same hash-and-sign family with any hash,
     * then requested_alg is compliant with policy_alg. */
    if( PSA_ALG_IS_HASH_AND_SIGN( requested_alg ) &&
        PSA_ALG_SIGN_GET_HASH( policy_alg ) == PSA_ALG_ANY_HASH )
    {
        return( ( policy_alg & ~PSA_ALG_HASH_MASK ) ==
                ( requested_alg & ~PSA_ALG_HASH_MASK ) );
    }
    /* If it isn't permitted, it's forbidden. */
    return( 0 );
}